

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::AddDirectLinkEntries(cmComputeLinkDepends *this)

{
  bool bVar1;
  reference item;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_28;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_20;
  const_iterator wi;
  cmLinkImplementation *impl;
  cmComputeLinkDepends *this_local;
  
  wi._M_current = (cmLinkItem *)cmGeneratorTarget::GetLinkImplementation(this->Target,&this->Config)
  ;
  AddLinkEntries<cmLinkImplItem>
            (this,-1,(vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)wi._M_current);
  local_20._M_current =
       (cmLinkItem *)
       std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                 ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)
                  ((long)&((wi._M_current)->super_string).field_2 + 8));
  while( true ) {
    local_28._M_current =
         (cmLinkItem *)
         std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                   ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)
                    ((long)&((wi._M_current)->super_string).field_2 + 8));
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    item = __gnu_cxx::
           __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
           ::operator*(&local_20);
    CheckWrongConfigItem(this,item);
    __gnu_cxx::
    __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
    operator++(&local_20);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::AddDirectLinkEntries()
{
  // Add direct link dependencies in this configuration.
  cmLinkImplementation const* impl =
    this->Target->GetLinkImplementation(this->Config);
  this->AddLinkEntries(-1, impl->Libraries);
  for(std::vector<cmLinkItem>::const_iterator
        wi = impl->WrongConfigLibraries.begin();
      wi != impl->WrongConfigLibraries.end(); ++wi)
    {
    this->CheckWrongConfigItem(*wi);
    }
}